

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileManager.hpp
# Opt level: O2

void __thiscall
sjtu::FileManager<sjtu::TrainManager::stationNameType>::save
          (FileManager<sjtu::TrainManager::stationNameType> *this,locType *offset)

{
  LRUCache<sjtu::TrainManager::stationNameType>::dirty_page_set
            ((this->super_FileManager_Base<sjtu::TrainManager::stationNameType>).cache,offset);
  return;
}

Assistant:

virtual void save(const locType &offset) override {cache -> dirty_page_set(offset);}